

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O0

int tnt_buf_reply(tnt_stream *s,tnt_reply *r)

{
  size_t sStack_30;
  int rc;
  size_t off;
  tnt_stream_buf *sb;
  tnt_reply *r_local;
  tnt_stream *s_local;
  
  off = (size_t)s->data;
  if (*(long *)off == 0) {
    s_local._4_4_ = -1;
  }
  else if (*(long *)(off + 8) == *(long *)(off + 0x18)) {
    s_local._4_4_ = 1;
  }
  else {
    sStack_30 = 0;
    sb = (tnt_stream_buf *)r;
    r_local = (tnt_reply *)s;
    s_local._4_4_ =
         tnt_reply(r,(char *)(*(long *)off + *(long *)(off + 0x18)),
                   *(long *)(off + 8) - *(long *)(off + 0x18),&stack0xffffffffffffffd0);
    if (s_local._4_4_ == 0) {
      *(size_t *)(off + 0x18) = sStack_30 + *(long *)(off + 0x18);
    }
  }
  return s_local._4_4_;
}

Assistant:

static int
tnt_buf_reply(struct tnt_stream *s, struct tnt_reply *r) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->data == NULL)
		return -1;
	if (sb->size == sb->rdoff)
		return 1;
	size_t off = 0;
	int rc = tnt_reply(r, sb->data + sb->rdoff, sb->size - sb->rdoff, &off);
	if (rc == 0)
		sb->rdoff += off;
	return rc;
}